

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O2

void Kit_TruthCofactor1New(uint *pOut,uint *pIn,int nVars,int iVar)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint *puVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  
  uVar7 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar7 = 1;
  }
  if (nVars <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitTruth.c"
                  ,0x242,"void Kit_TruthCofactor1New(unsigned int *, unsigned int *, int, int)");
  }
  switch(iVar) {
  case 0:
    uVar5 = 0;
    uVar9 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar9 = uVar5;
    }
    for (; uVar9 != uVar5; uVar5 = uVar5 + 1) {
      pOut[uVar5] = (pIn[uVar5] & 0xaaaaaaaa) >> 1 | pIn[uVar5] & 0xaaaaaaaa;
    }
    break;
  case 1:
    uVar5 = 0;
    uVar9 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar9 = uVar5;
    }
    for (; uVar9 != uVar5; uVar5 = uVar5 + 1) {
      pOut[uVar5] = (pIn[uVar5] & 0xcccccccc) >> 2 | pIn[uVar5] & 0xcccccccc;
    }
    break;
  case 2:
    uVar5 = 0;
    uVar9 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar9 = uVar5;
    }
    for (; uVar9 != uVar5; uVar5 = uVar5 + 1) {
      pOut[uVar5] = (pIn[uVar5] & 0xf0f0f0f0) >> 4 | pIn[uVar5] & 0xf0f0f0f0;
    }
    break;
  case 3:
    uVar5 = 0;
    uVar9 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar9 = uVar5;
    }
    for (; uVar9 != uVar5; uVar5 = uVar5 + 1) {
      pOut[uVar5] = (pIn[uVar5] & 0xff00ff00) >> 8 | pIn[uVar5] & 0xff00ff00;
    }
    break;
  case 4:
    uVar5 = 0;
    uVar9 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar9 = uVar5;
    }
    for (; uVar9 != uVar5; uVar5 = uVar5 + 1) {
      pOut[uVar5] = pIn[uVar5] >> 0x10 | pIn[uVar5] & 0xffff0000;
    }
    break;
  default:
    bVar2 = (char)iVar - 5;
    uVar8 = 1 << (bVar2 & 0x1f);
    iVar4 = 2 << (bVar2 & 0x1f);
    iVar3 = 0;
    uVar9 = 0;
    if (0 < (int)uVar8) {
      uVar9 = (ulong)uVar8;
    }
    puVar6 = pIn + (int)uVar8;
    for (; iVar3 < (int)uVar7; iVar3 = iVar3 + iVar4) {
      for (uVar5 = 0; uVar9 != uVar5; uVar5 = uVar5 + 1) {
        uVar1 = puVar6[uVar5];
        pOut[(long)(int)uVar8 + uVar5] = uVar1;
        pOut[uVar5] = uVar1;
      }
      pOut = pOut + iVar4;
      puVar6 = puVar6 + iVar4;
    }
  }
  return;
}

Assistant:

void Kit_TruthCofactor1New( unsigned * pOut, unsigned * pIn, int nVars, int iVar )
{
    int nWords = Kit_TruthWordNum( nVars );
    int i, k, Step;

    assert( iVar < nVars );
    switch ( iVar )
    {
    case 0:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & 0xAAAAAAAA) | ((pIn[i] & 0xAAAAAAAA) >> 1);
        return;
    case 1:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & 0xCCCCCCCC) | ((pIn[i] & 0xCCCCCCCC) >> 2);
        return;
    case 2:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & 0xF0F0F0F0) | ((pIn[i] & 0xF0F0F0F0) >> 4);
        return;
    case 3:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & 0xFF00FF00) | ((pIn[i] & 0xFF00FF00) >> 8);
        return;
    case 4:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pIn[i] & 0xFFFF0000) | ((pIn[i] & 0xFFFF0000) >> 16);
        return;
    default:
        Step = (1 << (iVar - 5));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
                pOut[i] = pOut[Step+i] = pIn[Step+i];
            pIn += 2*Step;
            pOut += 2*Step;
        }
        return;
    }
}